

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O0

void RDL_addOdd(uint r,uint y,uint z,RDL_graph *gra,RDL_sPathInfo *spi,RDL_cfURF *rc)

{
  uint uVar1;
  RDL_cfam **ppRVar2;
  RDL_cfam *pRVar3;
  char *pcVar4;
  RDL_cfam *new;
  RDL_cfURF *rc_local;
  RDL_sPathInfo *spi_local;
  RDL_graph *gra_local;
  uint z_local;
  uint y_local;
  uint r_local;
  
  if (rc->alloced == rc->nofFams) {
    rc->alloced = rc->alloced << 1;
    ppRVar2 = (RDL_cfam **)realloc(rc->fams,(ulong)rc->alloced << 3);
    rc->fams = ppRVar2;
  }
  if (rc->fams != (RDL_cfam **)0x0) {
    pRVar3 = (RDL_cfam *)malloc(0x28);
    pRVar3->r = r;
    pRVar3->p = y;
    pRVar3->q = z;
    pRVar3->x = 0xffffffff;
    pRVar3->mark = 0;
    pcVar4 = RDL_findPrototype(r,y,z,0xffffffff,gra,spi);
    pRVar3->prototype = pcVar4;
    pRVar3->weight = spi->dist[r][y] + spi->dist[r][z] + 1;
    uVar1 = rc->nofFams;
    rc->nofFams = uVar1 + 1;
    rc->fams[uVar1] = pRVar3;
  }
  return;
}

Assistant:

static void RDL_addOdd(unsigned r, unsigned y, unsigned z,
    RDL_graph *gra, RDL_sPathInfo *spi, RDL_cfURF *rc)
{
  RDL_cfam *new;
  if (rc->alloced == rc->nofFams) {
    rc->alloced *= 2;
    rc->fams = realloc(rc->fams, rc->alloced * sizeof(*rc->fams));
  }
  /* skip if we're out of memory... */
  if (rc->fams) {
    new = malloc(sizeof(*new));
    new->r = r;
    new->p = y;
    new->q = z;
    new->x = UINT_MAX; /*odd cycle*/
    new->mark = 0;
    new->prototype = RDL_findPrototype(r, y, z, UINT_MAX, gra, spi);
    new->weight = spi->dist[r][y] + spi->dist[r][z] + 1;
    rc->fams[rc->nofFams++] = new;
  }
}